

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O1

void __thiscall cfd::core::HashUtil::HashUtil(HashUtil *this,string *hash_type)

{
  ByteData *this_00;
  uint8_t uVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  CfdException *pCVar6;
  long lVar7;
  int iVar8;
  string name;
  string local_88;
  ByteData *local_68;
  HashUtil *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  string local_50;
  
  this->_vptr_HashUtil = (_func_int **)&PTR__HashUtil_00740618;
  this_00 = &this->buffer_;
  local_60 = this;
  ByteData::ByteData(this_00);
  local_68 = this_00;
  if (0x14 < hash_type->_M_string_length) {
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,"unsupported hash type.","");
    CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&local_88);
    __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  pcVar2 = (hash_type->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar2,pcVar2 + hash_type->_M_string_length);
  if (local_88._M_string_length != 0) {
    uVar5 = 0;
    do {
      if ((byte)(local_88._M_dataplus._M_p[uVar5] + 0xbfU) < 0x1a) {
        local_88._M_dataplus._M_p[uVar5] = local_88._M_dataplus._M_p[uVar5] | 0x20;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < local_88._M_string_length);
  }
  local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_88._M_dataplus._M_p;
  lVar7 = 0;
  do {
    uVar1 = (&DAT_00762a00)[lVar7];
    iVar8 = 0;
    if (uVar1 == '\0') {
      iVar8 = 5;
LAB_0030b7d4:
      bVar3 = false;
    }
    else {
      bVar3 = true;
      if (local_88._M_string_length == *(ulong *)((long)&DAT_007629e8 + lVar7)) {
        if (local_88._M_string_length != 0) {
          iVar4 = bcmp(local_58,*(void **)((long)&kFormatList + lVar7),local_88._M_string_length);
          if (iVar4 != 0) goto LAB_0030b7d7;
        }
        local_60->hash_type_ = uVar1;
        iVar8 = 1;
        goto LAB_0030b7d4;
      }
    }
LAB_0030b7d7:
    if (!bVar3) goto LAB_0030b7ef;
    lVar7 = lVar7 + 0x28;
  } while (lVar7 != 0xf0);
  iVar8 = 5;
LAB_0030b7ef:
  if (iVar8 != 5) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    return;
  }
  pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"unsupported hash type.","")
  ;
  CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&local_50);
  __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

HashUtil::HashUtil(const std::string &hash_type) {
  if (hash_type.length() > 20)
    throw CfdException(kCfdIllegalArgumentError, "unsupported hash type.");

  std::string name = hash_type;
  for (size_t index = 0; index < name.length(); ++index) {
    if ((name[index] >= 'A') && (name[index] <= 'Z')) {
      name[index] += 'a' - 'A';
    }
  }
  for (const auto &item : kFormatList) {
    if (item.type == 0) break;
    if (name == item.name) {
      hash_type_ = item.type;
      return;
    }
  }
  throw CfdException(kCfdIllegalArgumentError, "unsupported hash type.");
}